

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O0

Continuation * scm::trampoline::displayFunction(void)

{
  bool bVar1;
  Verbosity VVar2;
  uint uVar3;
  reference ppOVar4;
  ostream *poVar5;
  Continuation *pCVar6;
  int n;
  Object *obj;
  double __x;
  reverse_iterator<__gnu_cxx::__normal_iterator<scm::Object_**,_std::vector<scm::Object_*,_std::allocator<scm::Object_*>_>_>_>
  local_70;
  string local_68;
  undefined1 local_38 [16];
  reverse_iterator argument;
  ObjectVec arguments;
  int nArgs;
  
  VVar2 = loguru::current_verbosity_cutoff();
  if ((-1 < VVar2) && ((LOG_TRAMPOLINE_TRACE & 1) != 0)) {
    loguru::log(__x);
  }
  uVar3 = popArg<int>();
  popArgs<scm::Object*>
            ((vector<scm::Object_*,_std::allocator<scm::Object_*>_> *)&argument,
             (trampoline *)(ulong)uVar3,n);
  std::vector<scm::Object_*,_std::allocator<scm::Object_*>_>::rbegin
            ((vector<scm::Object_*,_std::allocator<scm::Object_*>_> *)(local_38 + 8));
  while( true ) {
    std::vector<scm::Object_*,_std::allocator<scm::Object_*>_>::rend
              ((vector<scm::Object_*,_std::allocator<scm::Object_*>_> *)local_38);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<scm::Object_**,_std::vector<scm::Object_*,_std::allocator<scm::Object_*>_>_>_>
                             *)(local_38 + 8),
                            (reverse_iterator<__gnu_cxx::__normal_iterator<scm::Object_**,_std::vector<scm::Object_*,_std::allocator<scm::Object_*>_>_>_>
                             *)local_38);
    if (!bVar1) break;
    ppOVar4 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<scm::Object_**,_std::vector<scm::Object_*,_std::allocator<scm::Object_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<scm::Object_**,_std::vector<scm::Object_*,_std::allocator<scm::Object_*>_>_>_>
                           *)(local_38 + 8));
    toString_abi_cxx11_(&local_68,(scm *)*ppOVar4,obj);
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)&local_68);
    std::operator<<(poVar5," ");
    std::__cxx11::string::~string((string *)&local_68);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<scm::Object_**,_std::vector<scm::Object_*,_std::allocator<scm::Object_*>_>_>_>
    ::operator++(&local_70,(int)local_38 + 8);
  }
  std::operator<<((ostream *)&std::cout,'\n');
  lastReturnValue = SCM_VOID;
  pCVar6 = popFunc();
  std::vector<scm::Object_*,_std::allocator<scm::Object_*>_>::~vector
            ((vector<scm::Object_*,_std::allocator<scm::Object_*>_> *)&argument);
  return pCVar6;
}

Assistant:

Continuation* displayFunction()
{
  DLOG_IF_F(INFO, LOG_TRAMPOLINE_TRACE, "in: displayFunction");
  int nArgs{popArg<int>()};
  ObjectVec arguments{popArgs<Object*>(nArgs)};
  for (auto argument{arguments.rbegin()}; argument != arguments.rend(); argument++) {
    std::cout << toString(*argument) << " ";
  }
  std::cout << '\n';
  t_RETURN(SCM_VOID);
}